

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99SeedVal(stb99_seed *seed)

{
  size_t r_00;
  bool_t bVar1;
  stb99_seed *in_RDI;
  size_t r;
  size_t i;
  err_t code;
  ulong local_20;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x128);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    for (local_20 = 0; (local_20 < 10 && (_ls[local_20] != in_RDI->l)); local_20 = local_20 + 1) {
    }
    if (local_20 == 10) {
      local_4 = 0x20c;
    }
    else {
      r_00 = _rs[local_20];
      local_4 = stb99ZiVal(in_RDI);
      if (((local_4 == 0) && (local_4 = stb99DiVal(in_RDI,r_00), local_4 == 0)) &&
         (local_4 = stb99RiVal(in_RDI,r_00), local_4 == 0)) {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

err_t stb99SeedVal(const stb99_seed* seed)
{
	err_t code;
	size_t i;
	size_t r;
	// проверить указатели
	if (!memIsValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// проверить l
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == seed->l)
			break;
	if (i == COUNT_OF(_ls))
		return ERR_BAD_SEED;
	// определить r = r(l)
	r = _rs[i];
	// проверить числа zi
	code = stb99ZiVal(seed);
	ERR_CALL_CHECK(code);
	// проверить цепочку di
	code = stb99DiVal(seed, r);
	ERR_CALL_CHECK(code);
	// проверить цепочку ri
	code = stb99RiVal(seed, r);
	ERR_CALL_CHECK(code);
	// все хорошо
	return ERR_OK;
}